

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> * __thiscall
el::base::TypedConfigurations::unsafeGetConfigByRef<std::shared_ptr<std::fstream>>
          (TypedConfigurations *this,Level level,
          map<el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
          *confMap,char *confName)

{
  iterator iVar1;
  _Base_ptr *pp_Var2;
  key_type local_18;
  Level local_14;
  
  local_14 = level;
  iVar1 = utils::std::
          _Rb_tree<el::Level,_std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::_Select1st<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
          ::find(&confMap->_M_t,&local_14);
  if ((_Rb_tree_header *)iVar1._M_node == &(confMap->_M_t)._M_impl.super__Rb_tree_header) {
    _local_18 = CONCAT44(local_14,1);
    pp_Var2 = (_Base_ptr *)
              utils::std::
              map<el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
              ::at(confMap,&local_18);
  }
  else {
    pp_Var2 = &iVar1._M_node[1]._M_parent;
  }
  return (shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *)pp_Var2;
}

Assistant:

Conf_T& unsafeGetConfigByRef(Level level, std::map<Level, Conf_T>* confMap, const char* confName) {
    ELPP_UNUSED(confName);
    typename std::map<Level, Conf_T>::iterator it = confMap->find(level);
    if (it == confMap->end()) {
      try {
        return confMap->at(Level::Global);
      } catch (...) {
        ELPP_INTERNAL_ERROR("Unable to get configuration [" << confName << "] for level ["
                            << LevelHelper::convertToString(level) << "]"
                            << std::endl << "Please ensure you have properly configured logger.", false);
      }
    }
    return it->second;
  }